

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O1

void comp_func_SourceOver_sse2(uint *destPixels,uint *srcPixels,int length,uint const_alpha)

{
  uint *puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint in_R11D;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  short sVar13;
  short sVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  ushort uVar17;
  undefined1 auVar18 [12];
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar30;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ushort uVar29;
  ushort uVar31;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ushort uVar37;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  undefined1 auVar38 [16];
  undefined1 auVar23 [16];
  
  if (const_alpha == 0xff) {
    uVar5 = (ulong)length;
    uVar6 = (ulong)(-((uint)((ulong)destPixels >> 2) & 0x3fffffff) & 3);
    if (uVar5 <= uVar6) {
      uVar6 = uVar5;
    }
    uVar7 = 0;
    if (uVar6 != 0) {
      do {
        in_R11D = srcPixels[uVar7];
        if (in_R11D < 0xff000000) {
          if (in_R11D != 0) {
            uVar11 = (ulong)(~in_R11D >> 0x18) *
                     (((ulong)destPixels[uVar7] << 0x18 | (ulong)destPixels[uVar7]) &
                     0xff00ff00ff00ff);
            uVar11 = uVar11 + 0x80008000800080 + (uVar11 >> 8 & 0xff00ff00ff00ff) >> 8 &
                     0xff00ff00ff00ff;
            in_R11D = ((uint)(uVar11 >> 0x18) | (uint)uVar11) + in_R11D;
            goto LAB_005b3e13;
          }
        }
        else {
LAB_005b3e13:
          destPixels[uVar7] = in_R11D;
        }
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    auVar14 = _DAT_006ce790;
    auVar4 = _DAT_006ce780;
    auVar3 = _DAT_00684850;
    if ((int)uVar7 < length + -3) {
      uVar7 = uVar7 & 0xffffffff;
      do {
        auVar16 = *(undefined1 (*) [16])(srcPixels + uVar7);
        auVar19 = auVar16 ^ auVar3;
        auVar32._0_4_ = -(uint)(0x7effffff < auVar19._0_4_);
        auVar32._4_4_ = -(uint)(0x7effffff < auVar19._4_4_);
        auVar32._8_4_ = -(uint)(0x7effffff < auVar19._8_4_);
        auVar32._12_4_ = -(uint)(0x7effffff < auVar19._12_4_);
        iVar9 = movmskps(in_R11D,auVar32);
        if (iVar9 == 0xf) {
          *(undefined1 (*) [16])(destPixels + uVar7) = auVar16;
          in_R11D = 0xf;
        }
        else {
          auVar20._0_4_ = -(uint)(-0x7f000001 < auVar19._0_4_);
          auVar20._4_4_ = -(uint)(-0x7f000001 < auVar19._4_4_);
          auVar20._8_4_ = -(uint)(-0x7f000001 < auVar19._8_4_);
          auVar20._12_4_ = -(uint)(-0x7f000001 < auVar19._12_4_);
          in_R11D = movmskps(iVar9,auVar20);
          if (in_R11D != 0) {
            auVar21._0_4_ = auVar16._0_4_ >> 0x18;
            auVar21._4_4_ = auVar16._4_4_ >> 0x18;
            auVar21._8_4_ = auVar16._8_4_ >> 0x18;
            auVar21._12_4_ = auVar16._12_4_ >> 0x18;
            auVar33._0_4_ = auVar21._0_4_ << 0x10;
            auVar33._4_4_ = auVar21._4_4_ << 0x10;
            auVar33._8_4_ = auVar21._8_4_ << 0x10;
            auVar33._12_4_ = auVar21._12_4_ << 0x10;
            auVar34 = (auVar33 | auVar21) ^ auVar4;
            auVar19 = *(undefined1 (*) [16])(destPixels + uVar7);
            uVar37 = (auVar19._0_2_ >> 8) * auVar34._0_2_;
            uVar39 = (auVar19._2_2_ >> 8) * auVar34._2_2_;
            uVar40 = (auVar19._4_2_ >> 8) * auVar34._4_2_;
            uVar41 = (auVar19._6_2_ >> 8) * auVar34._6_2_;
            uVar42 = (auVar19._8_2_ >> 8) * auVar34._8_2_;
            uVar43 = (auVar19._10_2_ >> 8) * auVar34._10_2_;
            uVar44 = (auVar19._12_2_ >> 8) * auVar34._12_2_;
            uVar45 = (auVar19._14_2_ >> 8) * auVar34._14_2_;
            auVar19 = auVar19 & auVar4;
            uVar17 = auVar19._0_2_ * auVar34._0_2_;
            uVar25 = auVar19._2_2_ * auVar34._2_2_;
            uVar26 = auVar19._4_2_ * auVar34._4_2_;
            uVar27 = auVar19._6_2_ * auVar34._6_2_;
            uVar28 = auVar19._8_2_ * auVar34._8_2_;
            uVar29 = auVar19._10_2_ * auVar34._10_2_;
            uVar30 = auVar19._12_2_ * auVar34._12_2_;
            uVar31 = auVar19._14_2_ * auVar34._14_2_;
            auVar38._0_2_ = uVar37 + 0x80 + (uVar37 >> 8);
            auVar38._2_2_ = uVar39 + 0x80 + (uVar39 >> 8);
            auVar38._4_2_ = uVar40 + 0x80 + (uVar40 >> 8);
            auVar38._6_2_ = uVar41 + 0x80 + (uVar41 >> 8);
            auVar38._8_2_ = uVar42 + 0x80 + (uVar42 >> 8);
            auVar38._10_2_ = uVar43 + 0x80 + (uVar43 >> 8);
            auVar38._12_2_ = uVar44 + 0x80 + (uVar44 >> 8);
            auVar38._14_2_ = uVar45 + 0x80 + (uVar45 >> 8);
            auVar22._0_2_ = (ushort)(uVar17 + 0x80 + (uVar17 >> 8)) >> 8;
            auVar22._2_2_ = (ushort)(uVar25 + 0x80 + (uVar25 >> 8)) >> 8;
            auVar22._4_2_ = (ushort)(uVar26 + 0x80 + (uVar26 >> 8)) >> 8;
            auVar22._6_2_ = (ushort)(uVar27 + 0x80 + (uVar27 >> 8)) >> 8;
            auVar22._8_2_ = (ushort)(uVar28 + 0x80 + (uVar28 >> 8)) >> 8;
            auVar22._10_2_ = (ushort)(uVar29 + 0x80 + (uVar29 >> 8)) >> 8;
            auVar22._12_2_ = (ushort)(uVar30 + 0x80 + (uVar30 >> 8)) >> 8;
            auVar22._14_2_ = (ushort)(uVar31 + 0x80 + (uVar31 >> 8)) >> 8;
            auVar22 = auVar22 | auVar38 & auVar14;
            puVar1 = destPixels + uVar7;
            *(char *)puVar1 = auVar22[0] + auVar16[0];
            *(char *)((long)puVar1 + 1) = auVar22[1] + auVar16[1];
            *(char *)((long)puVar1 + 2) = auVar22[2] + auVar16[2];
            *(char *)((long)puVar1 + 3) = auVar22[3] + auVar16[3];
            *(char *)(puVar1 + 1) = auVar22[4] + auVar16[4];
            *(char *)((long)puVar1 + 5) = auVar22[5] + auVar16[5];
            *(char *)((long)puVar1 + 6) = auVar22[6] + auVar16[6];
            *(char *)((long)puVar1 + 7) = auVar22[7] + auVar16[7];
            *(char *)(puVar1 + 2) = auVar22[8] + auVar16[8];
            *(char *)((long)puVar1 + 9) = auVar22[9] + auVar16[9];
            *(char *)((long)puVar1 + 10) = auVar22[10] + auVar16[10];
            *(char *)((long)puVar1 + 0xb) = auVar22[0xb] + auVar16[0xb];
            *(char *)(puVar1 + 3) = auVar22[0xc] + auVar16[0xc];
            *(char *)((long)puVar1 + 0xd) = auVar22[0xd] + auVar16[0xd];
            *(char *)((long)puVar1 + 0xe) = auVar22[0xe] + auVar16[0xe];
            *(char *)((long)puVar1 + 0xf) = auVar22[0xf] + auVar16[0xf];
          }
        }
        uVar7 = uVar7 + 4;
      } while ((long)uVar7 < (long)(length + -3));
    }
    if ((int)uVar7 < length) {
      uVar7 = uVar7 & 0xffffffff;
      lVar8 = 0;
      do {
        uVar10 = srcPixels[uVar7 + lVar8];
        if (uVar10 < 0xff000000) {
          if (uVar10 != 0) {
            uVar6 = (ulong)(~uVar10 >> 0x18) *
                    (((ulong)destPixels[uVar7 + lVar8] << 0x18 | (ulong)destPixels[uVar7 + lVar8]) &
                    0xff00ff00ff00ff);
            uVar6 = uVar6 + 0x80008000800080 + (uVar6 >> 8 & 0xff00ff00ff00ff) >> 8 &
                    0xff00ff00ff00ff;
            uVar10 = ((uint)(uVar6 >> 0x18) | (uint)uVar6) + uVar10;
            goto LAB_005b3f9d;
          }
        }
        else {
LAB_005b3f9d:
          destPixels[uVar7 + lVar8] = uVar10;
        }
      } while (((uint)lVar8 < 2) &&
              (lVar2 = uVar7 + 1 + lVar8, lVar8 = lVar8 + 1, lVar2 < (long)uVar5));
    }
  }
  else {
    uVar5 = (ulong)length;
    uVar6 = (ulong)(-((uint)((ulong)destPixels >> 2) & 0x3fffffff) & 3);
    if (uVar5 <= uVar6) {
      uVar6 = uVar5;
    }
    uVar7 = 0;
    if (uVar6 != 0) {
      do {
        uVar11 = (ulong)srcPixels[uVar7];
        if (uVar11 != 0) {
          uVar11 = ((uVar11 << 0x18 | uVar11) & 0xff00ff00ff00ff) * (ulong)const_alpha;
          uVar12 = uVar11 + 0x80008000800080 + (uVar11 >> 8 & 0xff00ff00ff00ff);
          uVar11 = uVar12 >> 8 & 0xff00ff00ff00ff;
          uVar12 = (((ulong)destPixels[uVar7] << 0x18 | (ulong)destPixels[uVar7]) & 0xff00ff00ff00ff
                   ) * (~uVar12 >> 0x38);
          uVar12 = uVar12 + 0x80008000800080 + (uVar12 >> 8 & 0xff00ff00ff00ff) >> 8 &
                   0xff00ff00ff00ff;
          destPixels[uVar7] =
               ((uint)(uVar12 >> 0x18) | (uint)uVar12) + ((uint)(uVar11 >> 0x18) | (uint)uVar11);
        }
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    auVar4 = _DAT_006ce790;
    auVar3 = _DAT_006ce780;
    iVar9 = length + -3;
    if ((int)uVar7 < iVar9) {
      auVar14 = pshuflw(ZEXT416(const_alpha),ZEXT416(const_alpha),0);
      uVar7 = uVar7 & 0xffffffff;
      lVar8 = (long)iVar9;
      do {
        auVar16 = *(undefined1 (*) [16])(srcPixels + uVar7);
        auVar19._0_4_ = -(uint)(auVar16._0_4_ == 0);
        auVar19._4_4_ = -(uint)(auVar16._4_4_ == 0);
        auVar19._8_4_ = -(uint)(auVar16._8_4_ == 0);
        auVar19._12_4_ = -(uint)(auVar16._12_4_ == 0);
        iVar9 = movmskps(iVar9,auVar19);
        if (iVar9 != 0xf) {
          sVar13 = auVar14._0_2_;
          uVar39 = (auVar16._0_2_ >> 8) * sVar13;
          sVar15 = auVar14._2_2_;
          uVar17 = (auVar16._2_2_ >> 8) * sVar15;
          uVar40 = (auVar16._4_2_ >> 8) * sVar13;
          uVar41 = (auVar16._6_2_ >> 8) * sVar15;
          uVar42 = (auVar16._8_2_ >> 8) * sVar13;
          uVar43 = (auVar16._10_2_ >> 8) * sVar15;
          uVar44 = (auVar16._12_2_ >> 8) * sVar13;
          uVar45 = (auVar16._14_2_ >> 8) * sVar15;
          auVar16 = auVar16 & auVar3;
          uVar25 = auVar16._0_2_ * sVar13;
          uVar26 = auVar16._2_2_ * sVar15;
          uVar27 = auVar16._4_2_ * sVar13;
          uVar28 = auVar16._6_2_ * sVar15;
          uVar29 = auVar16._8_2_ * sVar13;
          uVar30 = auVar16._10_2_ * sVar15;
          uVar31 = auVar16._12_2_ * sVar13;
          uVar37 = auVar16._14_2_ * sVar15;
          uVar17 = uVar17 + 0x80 + (uVar17 >> 8);
          auVar18._0_8_ =
               CONCAT26(uVar41 + 0x80 + (uVar41 >> 8),
                        CONCAT24(uVar40 + 0x80 + (uVar40 >> 8),
                                 CONCAT22(uVar17,uVar39 + 0x80 + (uVar39 >> 8))));
          auVar18._8_2_ = uVar42 + 0x80 + (uVar42 >> 8);
          auVar18._10_2_ = uVar43 + 0x80 + (uVar43 >> 8);
          auVar23._12_2_ = uVar44 + 0x80 + (uVar44 >> 8);
          auVar23._0_12_ = auVar18;
          auVar23._14_2_ = uVar45 + 0x80 + (uVar45 >> 8);
          auVar34._0_2_ = (ushort)(uVar25 + 0x80 + (uVar25 >> 8)) >> 8;
          auVar34._2_2_ = (ushort)(uVar26 + 0x80 + (uVar26 >> 8)) >> 8;
          auVar34._4_2_ = (ushort)(uVar27 + 0x80 + (uVar27 >> 8)) >> 8;
          auVar34._6_2_ = (ushort)(uVar28 + 0x80 + (uVar28 >> 8)) >> 8;
          auVar34._8_2_ = (ushort)(uVar29 + 0x80 + (uVar29 >> 8)) >> 8;
          auVar34._10_2_ = (ushort)(uVar30 + 0x80 + (uVar30 >> 8)) >> 8;
          auVar34._12_2_ = (ushort)(uVar31 + 0x80 + (uVar31 >> 8)) >> 8;
          auVar34._14_2_ = (ushort)(uVar37 + 0x80 + (uVar37 >> 8)) >> 8;
          auVar34 = auVar23 & auVar4 | auVar34;
          uVar17 = uVar17 >> 8;
          auVar24._2_2_ = 0;
          auVar24._0_2_ = uVar17;
          auVar24._4_4_ = (uint)((ulong)auVar18._0_8_ >> 0x38);
          auVar24._8_4_ = auVar18._8_4_ >> 0x18;
          auVar24._12_4_ = auVar23._12_4_ >> 0x18;
          auVar16._2_4_ = auVar24._4_4_ << 0x10;
          auVar16._0_2_ = uVar17;
          auVar16._6_4_ = auVar24._8_4_ << 0x10;
          auVar16._10_4_ = auVar24._12_4_ << 0x10;
          auVar16._14_2_ = 0;
          auVar19 = (auVar16 << 0x10 | auVar24) ^ auVar3;
          auVar16 = *(undefined1 (*) [16])(destPixels + uVar7);
          uVar37 = (auVar16._0_2_ >> 8) * auVar19._0_2_;
          uVar39 = (auVar16._2_2_ >> 8) * auVar19._2_2_;
          uVar40 = (auVar16._4_2_ >> 8) * auVar19._4_2_;
          uVar41 = (auVar16._6_2_ >> 8) * auVar19._6_2_;
          uVar42 = (auVar16._8_2_ >> 8) * auVar19._8_2_;
          uVar43 = (auVar16._10_2_ >> 8) * auVar19._10_2_;
          uVar44 = (auVar16._12_2_ >> 8) * auVar19._12_2_;
          uVar45 = (auVar16._14_2_ >> 8) * auVar19._14_2_;
          auVar16 = auVar16 & auVar3;
          uVar17 = auVar16._0_2_ * auVar19._0_2_;
          uVar25 = auVar16._2_2_ * auVar19._2_2_;
          uVar26 = auVar16._4_2_ * auVar19._4_2_;
          uVar27 = auVar16._6_2_ * auVar19._6_2_;
          uVar28 = auVar16._8_2_ * auVar19._8_2_;
          uVar29 = auVar16._10_2_ * auVar19._10_2_;
          uVar30 = auVar16._12_2_ * auVar19._12_2_;
          uVar31 = auVar16._14_2_ * auVar19._14_2_;
          auVar35._0_2_ = uVar37 + 0x80 + (uVar37 >> 8);
          auVar35._2_2_ = uVar39 + 0x80 + (uVar39 >> 8);
          auVar35._4_2_ = uVar40 + 0x80 + (uVar40 >> 8);
          auVar35._6_2_ = uVar41 + 0x80 + (uVar41 >> 8);
          auVar35._8_2_ = uVar42 + 0x80 + (uVar42 >> 8);
          auVar35._10_2_ = uVar43 + 0x80 + (uVar43 >> 8);
          auVar35._12_2_ = uVar44 + 0x80 + (uVar44 >> 8);
          auVar35._14_2_ = uVar45 + 0x80 + (uVar45 >> 8);
          auVar36._0_2_ = (ushort)(uVar17 + 0x80 + (uVar17 >> 8)) >> 8;
          auVar36._2_2_ = (ushort)(uVar25 + 0x80 + (uVar25 >> 8)) >> 8;
          auVar36._4_2_ = (ushort)(uVar26 + 0x80 + (uVar26 >> 8)) >> 8;
          auVar36._6_2_ = (ushort)(uVar27 + 0x80 + (uVar27 >> 8)) >> 8;
          auVar36._8_2_ = (ushort)(uVar28 + 0x80 + (uVar28 >> 8)) >> 8;
          auVar36._10_2_ = (ushort)(uVar29 + 0x80 + (uVar29 >> 8)) >> 8;
          auVar36._12_2_ = (ushort)(uVar30 + 0x80 + (uVar30 >> 8)) >> 8;
          auVar36._14_2_ = (ushort)(uVar31 + 0x80 + (uVar31 >> 8)) >> 8;
          auVar36 = auVar35 & auVar4 | auVar36;
          puVar1 = destPixels + uVar7;
          *(char *)puVar1 = auVar36[0] + auVar34[0];
          *(char *)((long)puVar1 + 1) = auVar36[1] + auVar34[1];
          *(char *)((long)puVar1 + 2) = auVar36[2] + auVar34[2];
          *(char *)((long)puVar1 + 3) = auVar36[3] + auVar34[3];
          *(char *)(puVar1 + 1) = auVar36[4] + auVar34[4];
          *(char *)((long)puVar1 + 5) = auVar36[5] + auVar34[5];
          *(char *)((long)puVar1 + 6) = auVar36[6] + auVar34[6];
          *(char *)((long)puVar1 + 7) = auVar36[7] + auVar34[7];
          *(char *)(puVar1 + 2) = auVar36[8] + auVar34[8];
          *(char *)((long)puVar1 + 9) = auVar36[9] + auVar34[9];
          *(char *)((long)puVar1 + 10) = auVar36[10] + auVar34[10];
          *(char *)((long)puVar1 + 0xb) = auVar36[0xb] + auVar34[0xb];
          *(char *)(puVar1 + 3) = auVar36[0xc] + auVar34[0xc];
          *(char *)((long)puVar1 + 0xd) = auVar36[0xd] + auVar34[0xd];
          *(char *)((long)puVar1 + 0xe) = auVar36[0xe] + auVar34[0xe];
          *(char *)((long)puVar1 + 0xf) = auVar36[0xf] + auVar34[0xf];
        }
        uVar7 = uVar7 + 4;
      } while ((long)uVar7 < lVar8);
    }
    if ((int)uVar7 < length) {
      uVar7 = uVar7 & 0xffffffff;
      lVar8 = 0;
      do {
        uVar6 = (ulong)srcPixels[uVar7 + lVar8];
        if (uVar6 != 0) {
          uVar6 = ((uVar6 << 0x18 | uVar6) & 0xff00ff00ff00ff) * (ulong)const_alpha;
          uVar6 = uVar6 + 0x80008000800080 + (uVar6 >> 8 & 0xff00ff00ff00ff);
          uVar11 = uVar6 >> 8 & 0xff00ff00ff00ff;
          uVar6 = (((ulong)destPixels[uVar7 + lVar8] << 0x18 | (ulong)destPixels[uVar7 + lVar8]) &
                  0xff00ff00ff00ff) * (~uVar6 >> 0x38);
          uVar6 = uVar6 + 0x80008000800080 + (uVar6 >> 8 & 0xff00ff00ff00ff) >> 8 & 0xff00ff00ff00ff
          ;
          destPixels[uVar7 + lVar8] =
               ((uint)(uVar6 >> 0x18) | (uint)uVar6) + ((uint)(uVar11 >> 0x18) | (uint)uVar11);
        }
      } while (((uint)lVar8 < 2) &&
              (lVar2 = uVar7 + 1 + lVar8, lVar8 = lVar8 + 1, lVar2 < (long)uVar5));
    }
  }
  return;
}

Assistant:

void QT_FASTCALL comp_func_SourceOver_sse2(uint *destPixels, const uint *srcPixels, int length, uint const_alpha)
{
    Q_ASSERT(const_alpha < 256);

    const quint32 *src = (const quint32 *) srcPixels;
    quint32 *dst = (quint32 *) destPixels;

    const __m128i nullVector = _mm_set1_epi32(0);
    const __m128i half = _mm_set1_epi16(0x80);
    const __m128i one = _mm_set1_epi16(0xff);
    const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
    if (const_alpha == 255) {
        const __m128i alphaMask = _mm_set1_epi32(0xff000000);
        BLEND_SOURCE_OVER_ARGB32_SSE2(dst, src, length, nullVector, half, one, colorMask, alphaMask);
    } else {
        const __m128i constAlphaVector = _mm_set1_epi16(const_alpha);
        BLEND_SOURCE_OVER_ARGB32_WITH_CONST_ALPHA_SSE2(dst, src, length, nullVector, half, one, colorMask, constAlphaVector);
    }
}